

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O3

zt_ipv4_node * zt_ipv4_tbl_search_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  byte bVar1;
  zt_ipv4_addr *pzVar2;
  zt_ipv4_addr *pzVar3;
  zt_ipv4_node *pzVar4;
  long lVar5;
  
  if (tbl->any != (zt_ipv4_node *)0x0) {
    return tbl->any;
  }
  bVar1 = tbl->in[0];
  if (bVar1 != 0) {
    pzVar2 = node->addr;
    lVar5 = 1;
    do {
      for (pzVar4 = tbl->tbl[bVar1 - 1][netmask_tbl[bVar1] & tbl->sz - 1 & pzVar2->addr];
          pzVar4 != (zt_ipv4_node *)0x0; pzVar4 = pzVar4->next) {
        if ((((pzVar2 != (zt_ipv4_addr *)0x0) &&
             (pzVar3 = pzVar4->addr, pzVar3 != (zt_ipv4_addr *)0x0)) &&
            (pzVar3->addr <= pzVar2->addr)) && (pzVar2->broadcast <= pzVar3->broadcast)) {
          return pzVar4;
        }
      }
      bVar1 = tbl->in[lVar5];
      lVar5 = lVar5 + 1;
    } while (bVar1 != 0);
  }
  return (zt_ipv4_node *)0x0;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    int           bit_iter;
    int           i = 0;
    zt_ipv4_node *match = NULL;

    if (tbl->any) {
        return tbl->any;
    }

    while (1) {
        uint32_t addr_masked;
        uint32_t key;

        bit_iter = tbl->in[i++];

        if (!bit_iter) {
            break;
        }

        addr_masked = node->addr->addr & netmask_tbl[bit_iter];
        key = addr_masked & (tbl->sz - 1);

        match = tbl->tbl[bit_iter - 1][key];

        while (match) {
            if (ipv4_tbl_addr_cmp(match->addr, node->addr)) {
                return match;
            }

            match = match->next;
        }
    }

    return NULL;
}